

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O0

void Abc_NtkFinLocalSetdown(Vec_Int_t *vPairs,Vec_Int_t *vList,Vec_Wec_t *vMap2)

{
  int iVar1;
  Vec_Int_t *p;
  Vec_Int_t *vArray;
  int iObj;
  int iFin;
  int i;
  Vec_Wec_t *vMap2_local;
  Vec_Int_t *vList_local;
  Vec_Int_t *vPairs_local;
  
  for (iObj = 0; iVar1 = Vec_IntSize(vList), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Vec_IntEntry(vList,iObj);
    iVar1 = Vec_IntEntry(vPairs,iVar1 << 1);
    p = Vec_WecEntry(vMap2,iVar1);
    Vec_IntClear(p);
  }
  return;
}

Assistant:

void Abc_NtkFinLocalSetdown( Vec_Int_t * vPairs, Vec_Int_t * vList, Vec_Wec_t * vMap2 )
{
    int i, iFin;
    Vec_IntForEachEntry( vList, iFin, i )
    {
        int iObj = Vec_IntEntry( vPairs, 2*iFin );
        Vec_Int_t * vArray = Vec_WecEntry( vMap2, iObj );
        Vec_IntClear( vArray );
    }
}